

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::transfer_by_intersection
               (Mesh *old_mesh,Mesh *new_mesh,TagBase *tagbase,Cavs *cavs,
               Write<double> *new_elem_densities_w)

{
  uint uVar1;
  Write<double> *this;
  Cavs *cavs_00;
  Write<double> local_120;
  Write<double> local_110;
  Write<double> local_100;
  Cavs local_f0;
  Cavs local_b0;
  Cavs local_70;
  
  uVar1 = Mesh::dim(old_mesh);
  if (uVar1 == 1) {
    Cavs::Cavs(&local_f0,cavs);
    this = &local_120;
    Write<double>::Write(this,new_elem_densities_w);
    cavs_00 = &local_f0;
    transfer_by_intersection_dim<1>(old_mesh,new_mesh,tagbase,cavs_00,this);
  }
  else if (uVar1 == 2) {
    Cavs::Cavs(&local_b0,cavs);
    this = &local_110;
    Write<double>::Write(this,new_elem_densities_w);
    cavs_00 = &local_b0;
    transfer_by_intersection_dim<2>(old_mesh,new_mesh,tagbase,cavs_00,this);
  }
  else {
    if (uVar1 != 3) {
      fail("unsupported dim %d\n",(ulong)uVar1);
    }
    Cavs::Cavs(&local_70,cavs);
    this = &local_100;
    Write<double>::Write(this,new_elem_densities_w);
    cavs_00 = &local_70;
    transfer_by_intersection_dim<3>(old_mesh,new_mesh,tagbase,cavs_00,this);
  }
  Write<double>::~Write(this);
  Cavs::~Cavs(cavs_00);
  return;
}

Assistant:

static void transfer_by_intersection(Mesh* old_mesh, Mesh* new_mesh,
    TagBase const* tagbase, Cavs cavs, Write<Real> new_elem_densities_w) {
  auto dim = old_mesh->dim();
  if (dim == 3) {
    transfer_by_intersection_dim<3>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else if (dim == 2) {
    transfer_by_intersection_dim<2>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else if (dim == 1) {
    transfer_by_intersection_dim<1>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else {
    Omega_h_fail("unsupported dim %d\n", dim);
  }
}